

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int gzwrite(gzFile file,voidpc buf,uint len)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong __n;
  uint uVar6;
  
  uVar6 = 0;
  uVar3 = 0;
  if (((file != (gzFile)0x0) && (uVar3 = uVar6, *file == 0x79b1)) &&
     (*(int *)((long)file + 0x6c) == 0)) {
    if ((int)len < 0) {
      gz_error((gz_statep)file,-5,"requested length does not fit in int");
    }
    else if ((len != 0) &&
            ((*(int *)((long)file + 0x18) != 0 || (iVar2 = gz_init((gz_statep)file), iVar2 != -1))))
    {
      if (*(int *)((long)file + 0x68) != 0) {
        *(undefined4 *)((long)file + 0x68) = 0;
        iVar2 = gz_zero((gz_statep)file,*(long *)((long)file + 0x60));
        if (iVar2 == -1) {
          return 0;
        }
      }
      if (len < *(uint *)((long)file + 0x18)) {
        uVar3 = 0;
        uVar6 = len;
        do {
          uVar1 = *(uint *)((long)file + 0x80);
          if ((ulong)uVar1 == 0) {
            lVar4 = *(long *)((long)file + 0x20);
            *(long *)((long)file + 0x78) = lVar4;
          }
          else {
            lVar4 = *(long *)((long)file + 0x78);
          }
          uVar5 = *(int *)((long)file + 0x18) - uVar1;
          if (uVar6 <= uVar5) {
            uVar5 = uVar6;
          }
          __n = (ulong)uVar5;
          memcpy((void *)(lVar4 + (ulong)uVar1),buf,__n);
          *(int *)((long)file + 0x80) = *(int *)((long)file + 0x80) + uVar5;
          *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + __n;
          uVar6 = uVar6 - uVar5;
          if (uVar6 == 0) goto LAB_00446c2a;
          buf = (voidpc)((long)buf + __n);
          iVar2 = gz_comp((gz_statep)file,0);
        } while (iVar2 != -1);
      }
      else {
        if ((*(int *)((long)file + 0x80) != 0) && (iVar2 = gz_comp((gz_statep)file,0), iVar2 == -1))
        {
          return 0;
        }
        *(uint *)((long)file + 0x80) = len;
        *(voidpc *)((long)file + 0x78) = buf;
        *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + (ulong)len;
        iVar2 = gz_comp((gz_statep)file,0);
        uVar3 = 0;
        if (iVar2 != -1) {
LAB_00446c2a:
          uVar3 = len;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int ZEXPORT gzwrite(gzFile file, voidpc buf, unsigned len)
{
    unsigned put = len;
    unsigned n;
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* since an int is returned, make sure len fits in one, otherwise return
       with an error (this avoids the flaw in the interface) */
    if ((int)len < 0) {
        gz_error(state, Z_BUF_ERROR, "requested length does not fit in int");
        return 0;
    }

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return 0;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return 0;
    }

    /* for small len, copy to input buffer, otherwise compress directly */
    if (len < state->size) {
        /* copy to input buffer, compress when full */
        do {
            if (strm->avail_in == 0)
                strm->next_in = state->in;
            n = state->size - strm->avail_in;
            if (n > len)
                n = len;
            memcpy(strm->next_in + strm->avail_in, buf, n);
            strm->avail_in += n;
            state->pos += n;
            buf = (char *)buf + n;
            len -= n;
            if (len && gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
        } while (len);
    }
    else {
        /* consume whatever's left in the input buffer */
        if (strm->avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;

        /* directly compress user buffer to file */
        strm->avail_in = len;
        strm->next_in = (unsigned char *)(voidp)buf;
        state->pos += len;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;
    }

    /* input was all buffered or compressed (put will fit in int) */
    return (int)put;
}